

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

Am_Value_List * __thiscall
Am_Value_List::Add(Am_Value_List *this,Am_Value *value,Am_Add_Position position,bool unique)

{
  Am_Value_List_Data *this_00;
  bool unique_local;
  Am_Add_Position position_local;
  Am_Value *value_local;
  Am_Value_List *this_local;
  
  if (this->data == (Am_Value_List_Data *)0x0) {
    this_00 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data::Am_Value_List_Data(this_00);
    this->data = this_00;
  }
  else if (unique) {
    Am_Value_List_Data::Make_Unique(this->data,&this->data,&this->item);
  }
  Am_Value_List_Data::Add(this->data,value,position);
  return this;
}

Assistant:

Am_Value_List &
Am_Value_List::Add(const Am_Value &value, Am_Add_Position position, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  } else
    data = new Am_Value_List_Data();
  data->Add(value, position);
  return *this;
}